

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.h
# Opt level: O2

Slice __thiscall leveldb::InternalKey::Encode(InternalKey *this)

{
  size_type sVar1;
  long in_FS_OFFSET;
  Slice SVar2;
  
  sVar1 = (this->rep_)._M_string_length;
  if (sVar1 == 0) {
    __assert_fail("!rep_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/dbformat.h"
                  ,0x96,"Slice leveldb::InternalKey::Encode() const");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    SVar2.size_ = sVar1;
    SVar2.data_ = (this->rep_)._M_dataplus._M_p;
    return SVar2;
  }
  __stack_chk_fail();
}

Assistant:

Slice Encode() const {
    assert(!rep_.empty());
    return rep_;
  }